

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O0

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_4
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  pointer *this_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  int iVar8;
  ulong uVar9;
  range_type *prVar10;
  uint uVar11;
  double dVar12;
  Vector_Data_DEF local_5b0;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_590;
  vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_580;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_568;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_558;
  vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_540;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_528;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_510;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_4f8;
  undefined1 local_4e8 [8];
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  for_xor_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b8;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_488;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_470;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_460;
  vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_450;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_430;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_420;
  vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_410;
  undefined4 local_3ec;
  uint local_3e8;
  uint32_t chosen_col;
  uint32_t last_group_condition;
  uint32_t orig_row_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> match_pos_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_398;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_380;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_370;
  vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_360;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_340;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_330;
  vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_320;
  int local_2fc;
  undefined1 local_2f8 [4];
  int j_1;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2d8;
  vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2c8;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2b0;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2a0;
  vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_288;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_270;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_258;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_240;
  undefined1 local_230 [8];
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  for_xor;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1e8;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1d8;
  vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_1c8;
  int local_1a4;
  undefined1 local_1a0 [4];
  uint32_t orig_row;
  vector<unsigned_int,_std::allocator<unsigned_int>_> match_pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_140;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_130;
  vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_120;
  int local_fc;
  uint local_f8;
  int j;
  int i;
  uint32_t _row;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  group_col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonZeros_pos;
  undefined1 local_a0 [16];
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_90;
  undefined1 local_68 [8];
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  U_upper;
  uint32_t nonZeros;
  uint32_t groups_num;
  uint32_t *M_local;
  Array_Data_Symbol *D_local;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *A_local;
  R10_Decoder *this_local;
  Array_Data_Symbol *result;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  dVar12 = ceil((double)this->A_u * 0.125);
  uVar9 = (ulong)dVar12;
  iVar8 = (int)uVar9;
  U_upper.data_.data_._4_4_ = 0;
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)local_a0,0,(ulong)this->A_i);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)
             &nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)this->A_i,(ulong)D->L);
  boost::numeric::ublas::
  project<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
            ((matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)(local_a0 + 0x10),(ublas *)A,
             (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_a0,
             (range_type *)
             &nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(range_type *)M);
  boost::numeric::ublas::
  matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  ::
  matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
            ((matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              *)local_68,
             (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)(local_a0 + 0x10));
  boost::numeric::ublas::
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~matrix_range((matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)(local_a0 + 0x10));
  this_00 = &group_col.data_.data_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  boost::numeric::ublas::
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)&i,8);
  for (local_f8 = 0; local_f8 < iVar8 - 1U; local_f8 = local_f8 + 1) {
    j = local_f8 * 0xff;
    for (local_fc = 0; uVar2 = (ulong)local_fc,
        sVar3 = boost::numeric::ublas::
                matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::size1((matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_68), uVar2 < sVar3; local_fc = local_fc + 1) {
      boost::numeric::ublas::
      row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&local_130,
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_68,(long)local_fc);
      prVar10 = (range_type *)(ulong)local_f8;
      boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                ((basic_range<unsigned_long,_long> *)&local_140,(long)(int)(local_f8 << 3),
                 (long)(int)(local_f8 * 8 + 8));
      boost::numeric::ublas::
      project<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                (&local_120,(ublas *)&local_130,&local_140,prVar10);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                   *)&i,(vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                         *)&local_120);
      boost::numeric::ublas::
      vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~vector_range(&local_120);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_row(&local_130);
      boost::numeric::ublas::
      vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::vector(&local_158,
               (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&i);
      sVar4 = boost::numeric::ublas::
              vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::size((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&i);
      U_upper.data_.data_._4_4_ = nonZeros_In_Row(this,&local_158,0,(int)sVar4 - 1);
      boost::numeric::ublas::
      vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~vector(&local_158);
      if (U_upper.data_.data_._4_4_ != 0) {
        boost::numeric::ublas::
        vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&i);
        sVar4 = boost::numeric::ublas::
                vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::size((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&i);
        find_nonZeros_pos_In_Row
                  (&local_170,this,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0,(int)sVar4 - 1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&group_col.data_.data_,
                   &local_170);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_170);
        boost::numeric::ublas::
        vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a0);
        local_1a4 = j;
        for (; (uint)j < (local_f8 + 1) * 0xff; j = j + 1) {
          boost::numeric::ublas::
          row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    ((ublas *)&local_1d8,&(this->precomput_param).U_p,(ulong)(uint)j);
          prVar10 = (range_type *)(ulong)local_f8;
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_1e8,(long)(int)(local_f8 << 3),
                     (long)(int)(local_f8 * 8 + 8));
          boost::numeric::ublas::
          project<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    (&local_1c8,(ublas *)&local_1d8,&local_1e8,prVar10);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)&i,(vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                             *)&local_1c8);
          boost::numeric::ublas::
          vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::~vector_range(&local_1c8);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~matrix_row(&local_1d8);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&for_xor.data_.data_,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&i);
          sVar4 = 7;
          find_nonZeros_pos_In_Row
                    (&local_200,this,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&for_xor.data_.data_,0,7);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a0,&local_200);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_200);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&for_xor.data_.data_);
          bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a0,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &group_col.data_.data_);
          if (bVar1) {
            boost::numeric::ublas::
            row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      ((ublas *)&local_240,A,(long)local_fc);
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_230,
                       (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_240);
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~matrix_row(&local_240);
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      (&local_288,(ublas *)local_230,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(ulong)this->A_i,(ulong)D->L,sVar4);
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_270,
                       (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_288);
            boost::numeric::ublas::
            row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      ((ublas *)&local_2b0,&(this->precomput_param).U_p,(ulong)(uint)j);
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_2a0,
                       (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_2b0);
            Utility::matrix_row_XOR(&local_258,&this->util,&local_270,&local_2a0);
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      (&local_2c8,(ublas *)local_230,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(ulong)this->A_i,(ulong)D->L,sVar4);
            boost::numeric::ublas::
            vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
            ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                         *)&local_2c8,
                        (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_258);
            boost::numeric::ublas::
            vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector_range(&local_2c8);
            boost::numeric::ublas::
            vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~vector(&local_258);
            boost::numeric::ublas::
            vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~vector(&local_2a0);
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~matrix_row(&local_2b0);
            boost::numeric::ublas::
            vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~vector(&local_270);
            boost::numeric::ublas::
            vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector_range(&local_288);
            boost::numeric::ublas::
            row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      ((ublas *)&local_2d8,A,(long)local_fc);
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
            ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                         *)&local_2d8,
                        (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_230);
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~matrix_row(&local_2d8);
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->d,(long)local_fc);
            pvVar6 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                               (&D->symbol,(ulong)*pvVar5);
            pvVar7 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                               (&(this->precomput_param).D_p.symbol,(ulong)(uint)j);
            Vector_Data_DEF::operator^((Vector_Data_DEF *)local_2f8,pvVar6,pvVar7);
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->d,(long)local_fc);
            pvVar6 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                               (&D->symbol,(ulong)*pvVar5);
            Vector_Data_DEF::operator=(pvVar6,(Vector_Data_DEF *)local_2f8);
            Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)local_2f8);
            boost::numeric::ublas::
            vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_230);
          }
        }
        j = local_1a4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a0);
      }
    }
  }
  j = (iVar8 + -1) * 0xff;
  for (local_2fc = 0; uVar2 = (ulong)local_2fc,
      sVar3 = boost::numeric::ublas::
              matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::size1((matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_68), uVar2 < sVar3; local_2fc = local_2fc + 1) {
    if ((this->A_u & 7) == 0) {
      boost::numeric::ublas::
      row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&local_330,
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_68,(long)local_2fc);
      uVar11 = iVar8 * 8 - 8;
      prVar10 = (range_type *)(ulong)uVar11;
      boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                ((basic_range<unsigned_long,_long> *)&local_340,(ulong)uVar11,
                 (ulong)(uint)(iVar8 << 3));
      boost::numeric::ublas::
      project<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                (&local_320,(ublas *)&local_330,&local_340,prVar10);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                   *)&i,(vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                         *)&local_320);
      boost::numeric::ublas::
      vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~vector_range(&local_320);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_row(&local_330);
    }
    else {
      boost::numeric::ublas::
      row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&local_370,
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_68,(long)local_2fc);
      prVar10 = (range_type *)(uVar9 & 0xffffffff);
      boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                ((basic_range<unsigned_long,_long> *)&local_380,(ulong)(iVar8 * 8 - 8),
                 (ulong)(((this->A_u & 7) - 8) + iVar8 * 8));
      boost::numeric::ublas::
      project<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                (&local_360,(ublas *)&local_370,&local_380,prVar10);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                   *)&i,(vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                         *)&local_360);
      boost::numeric::ublas::
      vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~vector_range(&local_360);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_row(&local_370);
    }
    boost::numeric::ublas::
    vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::vector(&local_398,
             (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)&i);
    sVar4 = boost::numeric::ublas::
            vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::size((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&i);
    U_upper.data_.data_._4_4_ = nonZeros_In_Row(this,&local_398,0,(int)sVar4 - 1);
    boost::numeric::ublas::
    vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~vector(&local_398);
    if (U_upper.data_.data_._4_4_ != 0) {
      boost::numeric::ublas::
      vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&match_pos_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&i);
      sVar4 = boost::numeric::ublas::
              vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::size((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&i);
      find_nonZeros_pos_In_Row
                (&local_3b0,this,
                 (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&match_pos_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,0,(int)sVar4 - 1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&group_col.data_.data_,
                 &local_3b0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3b0);
      boost::numeric::ublas::
      vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&match_pos_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&last_group_condition);
      chosen_col = j;
      local_3e8 = ((iVar8 + -1) * 0xff + (1 << ((byte)this->A_u & 7))) - 1;
      if ((this->A_u & 7) == 0) {
        local_3e8 = (iVar8 + -1) * 0xff + 0xff;
      }
      local_3ec = 0;
      for (; (uint)j < local_3e8; j = j + 1) {
        if ((this->A_u & 7) == 0) {
          boost::numeric::ublas::
          row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    ((ublas *)&local_420,&(this->precomput_param).U_p,(ulong)(uint)j);
          uVar11 = iVar8 * 8 - 8;
          prVar10 = (range_type *)(ulong)uVar11;
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_430,(ulong)uVar11,
                     (ulong)(uint)(iVar8 << 3));
          boost::numeric::ublas::
          project<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    (&local_410,(ublas *)&local_420,&local_430,prVar10);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)&i,(vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                             *)&local_410);
          boost::numeric::ublas::
          vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::~vector_range(&local_410);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~matrix_row(&local_420);
        }
        else {
          boost::numeric::ublas::
          row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    ((ublas *)&local_460,&(this->precomput_param).U_p,(ulong)(uint)j);
          prVar10 = (range_type *)(uVar9 & 0xffffffff);
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_470,(ulong)(iVar8 * 8 - 8),
                     (ulong)(((this->A_u & 7) - 8) + iVar8 * 8));
          boost::numeric::ublas::
          project<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    (&local_450,(ublas *)&local_460,&local_470,prVar10);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)&i,(vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                             *)&local_450);
          boost::numeric::ublas::
          vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::~vector_range(&local_450);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~matrix_row(&local_460);
        }
        if ((this->A_u & 7) == 0) {
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::vector(&local_4a0,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&i);
          sVar4 = 7;
          find_nonZeros_pos_In_Row(&local_488,this,&local_4a0,0,7);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&last_group_condition,
                     &local_488);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_488);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector(&local_4a0);
        }
        else {
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&for_xor_1.data_.data_,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&i);
          uVar11 = (this->A_u & 7) - 1;
          sVar4 = (size_type)uVar11;
          find_nonZeros_pos_In_Row
                    (&local_4b8,this,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&for_xor_1.data_.data_,0,uVar11);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&last_group_condition,
                     &local_4b8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4b8);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&for_xor_1.data_.data_);
        }
        bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &last_group_condition,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &group_col.data_.data_);
        if (bVar1) {
          boost::numeric::ublas::
          row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    ((ublas *)&local_4f8,A,(long)local_2fc);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)local_4e8,
                     (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_4f8);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~matrix_row(&local_4f8);
          boost::numeric::ublas::
          subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    (&local_540,(ublas *)local_4e8,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(ulong)this->A_i,(ulong)D->L,sVar4);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_528,
                     (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_540);
          boost::numeric::ublas::
          row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    ((ublas *)&local_568,&(this->precomput_param).U_p,(ulong)(uint)j);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_558,
                     (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_568);
          Utility::matrix_row_XOR(&local_510,&this->util,&local_528,&local_558);
          boost::numeric::ublas::
          subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    (&local_580,(ublas *)local_4e8,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(ulong)this->A_i,(ulong)D->L,sVar4);
          boost::numeric::ublas::
          vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
          ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                       *)&local_580,
                      (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&local_510);
          boost::numeric::ublas::
          vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector_range(&local_580);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector(&local_510);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector(&local_558);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~matrix_row(&local_568);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector(&local_528);
          boost::numeric::ublas::
          vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector_range(&local_540);
          boost::numeric::ublas::
          row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    ((ublas *)&local_590,A,(long)local_2fc);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
          ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                       *)&local_590,
                      (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_4e8);
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~matrix_row(&local_590);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->d,(long)local_2fc);
          pvVar6 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                             (&D->symbol,(ulong)*pvVar5);
          pvVar7 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                             (&(this->precomput_param).D_p.symbol,(ulong)(uint)j);
          Vector_Data_DEF::operator^(&local_5b0,pvVar6,pvVar7);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->d,(long)local_2fc);
          pvVar6 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                             (&D->symbol,(ulong)*pvVar5);
          Vector_Data_DEF::operator=(pvVar6,&local_5b0);
          Vector_Data_DEF::~Vector_Data_DEF(&local_5b0);
          boost::numeric::ublas::
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_4e8);
        }
      }
      j = chosen_col;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&last_group_condition);
    }
  }
  Array_Data_Symbol::operator=(__return_storage_ptr__,D);
  boost::numeric::ublas::
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~vector((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)&i);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&group_col.data_.data_);
  boost::numeric::ublas::
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~matrix((matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)local_68);
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_4(matrix<uint8_t> &A, class Array_Data_Symbol &D,  uint32_t &M)
{

	/*
	For each of the first i rows of A, for each group of 8 columns in the
   U_upper submatrix of this row, if the set of 8 column entries in
   U_upper are not all zero, then the row of the precomputation matrix
   U' that matches the pattern in the 8 columns is exclusive-ORed into
   the row, thus zeroing out those 8 columns in the row at the cost of
   exclusive-ORing one row of U' into the row.
	
	*/

	class Array_Data_Symbol result;

	uint32_t groups_num = std::ceil(A_u / 8.0);

	uint32_t nonZeros = 0;

	ublas::matrix<uint8_t> U_upper =  ublas::project(A, range(0, A_i), range(A_i, D.L));

	std::vector<uint32_t> nonZeros_pos;
	nonZeros_pos.clear();

	ublas::vector<uint8_t> group_col(8);



	// for (int i = 0; i < U_upper.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < U_upper.size2(); j++)
	// 	{
	// 		printf("%d ",  U_upper(i, j));  
	// 	}
	// 	printf("\n");
	// }

	//groups_num = 1;
	uint32_t _row = 0;
	for (int i = 0; i < groups_num - 1; i++)
	{


		_row = i * 255;
		for (int j = 0; j < U_upper.size1(); j++)
		{

			group_col = ublas::project(ublas::row(U_upper, j), range(8 * i, 8 * i + 8));

			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

			nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
		//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

			if (nonZeros == 0)
			{
				continue;
			}


		//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

			nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

			// for (int k = 0; k < nonZeros_pos.size(); k++)
			// {
			// 	std::cout << "  " << nonZeros_pos[k];
			// }
			// std::cout << std::endl;


		//	std::cout << "match_pos: " << std::endl;
			std::vector<uint32_t> match_pos;
			//	printf(" %d \n", _row);
			uint32_t orig_row = _row;
			while(_row < 255 * (i + 1))
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * i, 8 * i + 8));

//				match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * i, 8 * i + 8 - 1);
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);
				


				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				//std::cout << std::endl;

				if (match_pos == nonZeros_pos)
				{
			//		std::cout << "match_pos == nonZeros_pos" << std::endl;
					// for (int k = 0; k < nonZeros_pos.size(); k++)
					// {
					// 	std::cout << "  " << nonZeros_pos[k];
					// }
					// std::cout << std::endl;

					// for (int k = 0; k < match_pos.size(); k++)
					// {
					// 	printf(" %d ", match_pos[k]);
					// }
					// std::cout << std::endl;


					ublas::vector<uint8_t> for_xor = ublas::row(A, j);
					 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
					//exit(0);
					 D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				}
				// the _row can increase after matching.
				_row++;

			}
			_row = orig_row;


		//	std::cout << std::endl;
		}
		
	}

				


	// last group handle
	//std::cout << "last group handle: " << std::endl;


	_row = (groups_num - 1) * 255;
	for (int j = 0; j < U_upper.size1(); j++)
	{

		if (A_u % 8 == 0)
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + 8));
		}
		else
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8));
		}
		

		// for (int k = 0; k < group_col.size(); k++)
		// {
		// 	printf(" %d ", group_col(k));
		// }
		// std::cout << std::endl;
	



		nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
	//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

		if (nonZeros == 0)
		{
			continue;
		}

			

	//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

		nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

		// for (int k = 0; k < nonZeros_pos.size(); k++)
		// {
		// 	std::cout << " " << nonZeros_pos[k];
		// }
		// std::cout << std::endl;



	//	std::cout << "match_pos: " << std::endl;
		std::vector<uint32_t> match_pos;
		//	printf(" %d \n", _row);
		uint32_t orig_row = _row;


		uint32_t last_group_condition = 255 * (groups_num - 1) + (1 << A_u % 8) - 1;

		if (A_u % 8 == 0)
		{
			last_group_condition = 255 * (groups_num - 1) + 255;
		}

		uint32_t chosen_col = 0;

	//	std::cout << "last_group_condition: " << last_group_condition << std::endl;

		//while(_row < 255 * (groups_num - 1) + (1 << A_u % 8) - 1 )
		while(_row < last_group_condition)
		{





			if (A_u % 8 == 0)
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + 8));
			}
			else
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + A_u % 8));

			}


			//match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8 - 1);

			if (A_u % 8 == 0)
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);

			}
			else
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, A_u % 8 - 1);

			}


			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

				// for (int k = 0; k < precomput_param.U_p.size2(); k++)
				// {
				// 	printf(" %d ", precomput_param.U_p(_row,k));
					
				// }

				//std::cout << A_u % 8 - 1 << std::endl;


			// for (int k = 0; k < match_pos.size(); k++)
			// {
			// 	printf(" %d ", match_pos[k]);
			// }
			// std::cout << std::endl;




	//		std::cout << "_row: "<< _row << std::endl;

			if (match_pos == nonZeros_pos)
			{

				// std::cout << "match_pos == nonZeros_pos" << std::endl;


				// for (int k = 0; k < nonZeros_pos.size(); k++)
				// {
				// 	std::cout << "  " << nonZeros_pos[k];
				// }
				// std::cout << std::endl;

				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				// std::cout << std::endl;


				ublas::vector<uint8_t> for_xor = ublas::row(A, j);
				 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
				
				D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				

			}
			_row++;


		}
		_row = orig_row;


//		std::cout << std::endl;
	}

	// for (int i = 0; i < precomput_param.U_p.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < precomput_param.U_p.size2(); j++)
	// 	{
	// 		printf("%d ",  precomput_param.U_p(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	// for (int i = 0; i < A.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < A.size2(); j++)
	// 	{
	// 		printf("%d ",  A(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	result = D;


	return result;
}